

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_353bb::ImageManager::_clone
          (ImageManager *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CopyForm1 p_Var1;
  Image *temp;
  uint8_t in_stack_ffffffffffffffae;
  uint8_t in_stack_ffffffffffffffaf;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  undefined6 in_stack_ffffffffffffffb8;
  uint8_t in_stack_ffffffffffffffbe;
  uint8_t in_stack_ffffffffffffffbf;
  ImageTypeManager *in_stack_ffffffffffffffc0;
  
  ImageTypeManager::image
            ((ImageTypeManager *)
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)),
             (uint8_t)(in_stack_ffffffffffffffb4 >> 0x18));
  PenguinV_Image::ImageTemplate<unsigned_char>::width((ImageTemplate<unsigned_char> *)__child_stack)
  ;
  PenguinV_Image::ImageTemplate<unsigned_char>::height
            ((ImageTemplate<unsigned_char> *)__child_stack);
  PenguinV_Image::ImageTemplate<unsigned_char>::colorCount
            ((ImageTemplate<unsigned_char> *)__child_stack);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            ((ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)),
             in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,
             in_stack_ffffffffffffffae);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x124fb7);
  PenguinV_Image::ImageTemplate<unsigned_char>::type((ImageTemplate<unsigned_char> *)__child_stack);
  p_Var1 = ImageTypeManager::convert
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,in_stack_ffffffffffffffbe)
  ;
  (*p_Var1)((Image *)__child_stack,(Image *)this);
  return (int)this;
}

Assistant:

PenguinV_Image::Image _clone( const PenguinV_Image::Image & in )
        {
            PenguinV_Image::Image temp = _registrator.image( _type ).generate( in.width(), in.height(), in.colorCount() );
            _registrator.convert( in.type(), _type )( in, temp );
            return temp;
        }